

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# OpenSteerDemo.cpp
# Opt level: O2

void __thiscall
OpenSteer::OpenSteerDemo::drawCircleHighlightOnVehicle
          (OpenSteerDemo *this,AbstractVehicle *v,float radiusMultiplier,Color *color)

{
  undefined8 uVar1;
  float fVar2;
  float fVar3;
  undefined8 uVar4;
  float in_XMM1_Da;
  float local_48;
  float fStack_44;
  Vec3 local_38;
  Vec3 local_28;
  
  fVar2 = camera.super_LocalSpace._position.z;
  uVar1 = camera.super_LocalSpace._position._0_8_;
  if (this != (OpenSteerDemo *)0x0) {
    fVar3 = (float)(**(code **)(*(long *)this + 0xc0))();
    local_28._0_8_ = (**(code **)(*(long *)this + 0x40))(this);
    uVar4 = (**(code **)(*(long *)this + 0x40))(this);
    local_48 = (float)uVar1;
    fStack_44 = SUB84(uVar1,4);
    local_38.z = in_XMM1_Da - fVar2;
    local_38.y = (float)((ulong)uVar4 >> 0x20) - fStack_44;
    local_38.x = (float)uVar4 - local_48;
    draw3dCircle(fVar3 * radiusMultiplier,&local_28,&local_38,(Color *)v,0x14);
  }
  return;
}

Assistant:

void 
OpenSteer::OpenSteerDemo::drawCircleHighlightOnVehicle (const AbstractVehicle* v,
                                                  const float radiusMultiplier,
                                                  const Color& color)
{
    if (v)
    {
        const Vec3& cPosition = camera.position();
        draw3dCircle  (v->radius() * radiusMultiplier,  // adjusted radius
                       v->position(),                   // center
                       v->position() - cPosition,       // view axis
                       color,                          // drawing color
                       20);                            // circle segments
    }
}